

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O3

bool __thiscall
cmQtAutoGen::RccLister::list
          (RccLister *this,string *qrcFile,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,string *error,bool verbose)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmQtAutoGen *pcVar3;
  uint uVar4;
  pointer pbVar5;
  size_type sVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  istream *piVar10;
  long lVar11;
  string *psVar12;
  int *retVal_00;
  char *pcVar13;
  string *entry;
  _Alloc_hider _Var14;
  pointer in_path;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string eline;
  string oline;
  int retVal;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmd;
  string qrcContents;
  string rccStdErr;
  string rccStdOut;
  string fileDir;
  istringstream ostr;
  ostringstream osst;
  string local_5a0;
  string local_580;
  int local_544;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_540;
  undefined1 local_538 [40];
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  undefined1 local_490 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_480;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_470;
  string *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  ios_base local_418 [144];
  char *local_388;
  char *local_280;
  char *local_270;
  int local_268;
  undefined1 local_260 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_240;
  string *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  ios_base local_1f0 [152];
  char *local_158;
  char *local_50;
  char *local_40;
  int local_38;
  
  error->_M_string_length = 0;
  *(error->_M_dataplus)._M_p = '\0';
  psVar12 = error;
  local_540 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)files;
  bVar7 = cmsys::SystemTools::FileExists(qrcFile,true);
  if (!bVar7) {
    text._M_str = (char *)psVar12;
    text._M_len = (size_t)(qrcFile->_M_dataplus)._M_p;
    Quoted_abi_cxx11_(&local_580,(cmQtAutoGen *)qrcFile->_M_string_length,text);
    local_490._0_8_ = (pointer)0x12;
    local_490._8_8_ = "The resource file ";
    local_480._M_allocated_capacity = 0;
    local_480._8_8_ = local_580._M_string_length;
    local_470 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_580._M_dataplus._M_p;
    local_460 = (char *)0x10;
    local_458 = " does not exist.";
    local_450 = (char *)0x0;
    views_00._M_len = 3;
    views_00._M_array = (iterator)local_490;
    local_468 = &local_580;
    cmCatViews((string *)local_260,views_00);
    std::__cxx11::string::operator=((string *)error,(string *)local_260);
    if ((cmQtAutoGen *)local_260._0_8_ != (cmQtAutoGen *)(local_260 + 0x10)) {
      operator_delete((void *)local_260._0_8_,(ulong)(local_250._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_580._M_dataplus._M_p != &local_580.field_2) {
      operator_delete(local_580._M_dataplus._M_p,
                      (ulong)(local_580.field_2._M_allocated_capacity + 1));
    }
    return false;
  }
  cmsys::SystemTools::GetFilenamePath(&local_4b0,qrcFile);
  if ((((this->RccExcutable_)._M_string_length == 0) ||
      (bVar7 = cmsys::SystemTools::FileExists(&this->RccExcutable_,true), !bVar7)) ||
     ((this->ListOptions_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->ListOptions_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    local_510._M_string_length = 0;
    local_510.field_2._M_local_buf[0] = '\0';
    local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
    std::ifstream::ifstream(local_490,(qrcFile->_M_dataplus)._M_p,_S_in);
    if ((*(byte *)((long)&local_470 + *(long *)(local_490._0_8_ + -0x18)) & 5) == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_260);
      std::ostream::operator<<(local_260,(streambuf *)(local_490 + 0x10));
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&local_510,(string *)&local_580);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_580._M_dataplus._M_p != &local_580.field_2) {
        operator_delete(local_580._M_dataplus._M_p,
                        (ulong)(local_580.field_2._M_allocated_capacity + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_260);
      std::ios_base::~ios_base(local_1f0);
      std::ifstream::~ifstream(local_490);
      local_280 = (char *)0x0;
      local_270 = (char *)0x0;
      local_268 = 0;
      memset((RegularExpression *)local_490,0,0x20a);
      cmsys::RegularExpression::compile((RegularExpression *)local_490,"(<file[^<]+)");
      local_50 = (char *)0x0;
      local_40 = (char *)0x0;
      local_38 = 0;
      memset((RegularExpression *)local_260,0,0x20a);
      cmsys::RegularExpression::compile((RegularExpression *)local_260,"(^<file[^>]*>)");
      paVar1 = &local_5a0.field_2;
      _Var14._M_p = local_510._M_dataplus._M_p;
      while (bVar7 = cmsys::RegularExpression::find
                               ((RegularExpression *)local_490,_Var14._M_p,
                                (RegularExpressionMatch *)local_490), bVar7) {
        if ((char *)local_490._8_8_ == (char *)0x0) {
          local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
          local_580._M_string_length = 0;
          local_580.field_2._M_allocated_capacity =
               local_580.field_2._M_allocated_capacity & 0xffffffffffffff00;
        }
        else {
          local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_580,local_490._8_8_,local_388);
        }
        sVar6 = local_580._M_string_length;
        cmsys::RegularExpression::find
                  ((RegularExpression *)local_260,local_580._M_dataplus._M_p,
                   (RegularExpressionMatch *)local_260);
        local_5a0._M_dataplus._M_p = (pointer)paVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._8_8_ ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          local_5a0._M_string_length = 0;
          local_5a0.field_2._M_local_buf[0] = '\0';
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_5a0,local_260._8_8_,local_158);
        }
        std::__cxx11::string::substr((ulong)local_538,(ulong)&local_580);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  (local_540,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_538);
        if ((pointer)local_538._0_8_ != (pointer)(local_538 + 0x10)) {
          operator_delete((void *)local_538._0_8_,(ulong)(local_538._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a0._M_dataplus._M_p != paVar1) {
          operator_delete(local_5a0._M_dataplus._M_p,
                          CONCAT71(local_5a0.field_2._M_allocated_capacity._1_7_,
                                   local_5a0.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_580._M_dataplus._M_p != &local_580.field_2) {
          operator_delete(local_580._M_dataplus._M_p,
                          (ulong)(local_580.field_2._M_allocated_capacity + 1));
        }
        _Var14._M_p = _Var14._M_p + sVar6;
      }
      if (local_40 != (char *)0x0) {
        operator_delete__(local_40);
      }
      if (local_270 != (char *)0x0) {
        operator_delete__(local_270);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_510._M_dataplus._M_p != &local_510.field_2) {
        operator_delete(local_510._M_dataplus._M_p,
                        CONCAT71(local_510.field_2._M_allocated_capacity._1_7_,
                                 local_510.field_2._M_local_buf[0]) + 1);
      }
LAB_00603d2c:
      in_path = *(pointer *)local_540;
      pbVar5 = *(pointer *)(local_540 + 8);
      bVar7 = true;
      if (in_path != pbVar5) {
        do {
          cmsys::SystemTools::CollapseFullPath((string *)local_490,in_path,&local_4b0);
          std::__cxx11::string::operator=((string *)in_path,(string *)local_490);
          if ((undefined1 *)local_490._0_8_ != local_490 + 0x10) {
            operator_delete((void *)local_490._0_8_,local_480._M_allocated_capacity + 1);
          }
          in_path = in_path + 1;
        } while (in_path != pbVar5);
      }
      goto LAB_00603d96;
    }
    text_00._M_str = (char *)psVar12;
    text_00._M_len = (size_t)(qrcFile->_M_dataplus)._M_p;
    Quoted_abi_cxx11_(&local_5a0,(cmQtAutoGen *)qrcFile->_M_string_length,text_00);
    local_260._0_8_ = (cmQtAutoGen *)0x12;
    local_260._8_8_ = "The resource file ";
    local_250._M_allocated_capacity = 0;
    local_250._8_8_ = local_5a0._M_string_length;
    local_240 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5a0._M_dataplus._M_p;
    local_230 = &DAT_00000011;
    local_228 = " is not readable\n";
    local_220 = (char *)0x0;
    views_01._M_len = 3;
    views_01._M_array = (iterator)local_260;
    local_238 = &local_5a0;
    cmCatViews(&local_580,views_01);
    std::__cxx11::string::operator=((string *)error,(string *)&local_580);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_580._M_dataplus._M_p != &local_580.field_2) {
      operator_delete(local_580._M_dataplus._M_p,
                      (ulong)(local_580.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
      operator_delete(local_5a0._M_dataplus._M_p,
                      CONCAT71(local_5a0.field_2._M_allocated_capacity._1_7_,
                               local_5a0.field_2._M_local_buf[0]) + 1);
    }
    std::ifstream::~ifstream(local_490);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_510._M_dataplus._M_p != &local_510.field_2) {
      lVar11 = CONCAT71(local_510.field_2._M_allocated_capacity._1_7_,
                        local_510.field_2._M_local_buf[0]);
      _Var14._M_p = local_510._M_dataplus._M_p;
      goto LAB_006034c6;
    }
  }
  else {
    local_544 = 0;
    local_4d0._M_string_length = 0;
    local_4d0.field_2._M_local_buf[0] = '\0';
    local_4f0._M_string_length = 0;
    local_4f0.field_2._M_local_buf[0] = '\0';
    local_538._16_8_ = (pointer)0x0;
    local_538._0_8_ = (pointer)0x0;
    local_538._8_8_ = (pointer)0x0;
    local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
    local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_538,
               &this->RccExcutable_);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_538,
               local_538._8_8_,
               (this->ListOptions_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (this->ListOptions_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    cmsys::SystemTools::GetFilenameName((string *)local_490,qrcFile);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_538,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_490);
    pcVar2 = local_490 + 0x10;
    if ((pointer)local_490._0_8_ != pcVar2) {
      operator_delete((void *)local_490._0_8_,local_480._M_allocated_capacity + 1);
    }
    if (verbose) {
      QuotedCommand(&local_5a0,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_538);
      local_490._0_8_ = &DAT_00000011;
      local_490._8_8_ = "Running command:\n";
      local_480._M_allocated_capacity = 0;
      local_480._8_8_ = local_5a0._M_string_length;
      local_470 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5a0._M_dataplus._M_p;
      local_458 = local_250._M_local_buf + 8;
      local_260._0_8_ = (cmQtAutoGen *)0x0;
      local_260._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x1;
      local_250._M_local_buf[8] = 10;
      local_460 = (char *)0x1;
      local_450 = (char *)0x0;
      views._M_len = 3;
      views._M_array = (iterator)local_490;
      local_468 = &local_5a0;
      local_250._M_allocated_capacity = (size_type)local_458;
      cmCatViews(&local_580,views);
      cmSystemTools::Stdout(&local_580);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_580._M_dataplus._M_p != &local_580.field_2) {
        operator_delete(local_580._M_dataplus._M_p,
                        (ulong)(local_580.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
        operator_delete(local_5a0._M_dataplus._M_p,
                        CONCAT71(local_5a0.field_2._M_allocated_capacity._1_7_,
                                 local_5a0.field_2._M_local_buf[0]) + 1);
      }
    }
    retVal_00 = &local_544;
    bVar7 = cmSystemTools::RunSingleCommand
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_538,&local_4d0,&local_4f0,retVal_00,local_4b0._M_dataplus._M_p,
                       OUTPUT_NONE,(cmDuration)0x0,Auto);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_538);
    if (bVar7 && local_544 == 0) {
      std::__cxx11::istringstream::istringstream
                ((istringstream *)local_490,(string *)&local_4d0,_S_in);
      local_580._M_string_length = 0;
      local_580.field_2._M_allocated_capacity =
           local_580.field_2._M_allocated_capacity & 0xffffffffffffff00;
      pcVar3 = (cmQtAutoGen *)(local_260 + 0x10);
      local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
      while( true ) {
        cVar8 = std::ios::widen((char)*(undefined8 *)(local_490._0_8_ + -0x18) +
                                (char)(istream *)local_490);
        piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                            ((istream *)local_490,(string *)&local_580,cVar8);
        if (((&piVar10->field_0x20)[(long)piVar10->_vptr_basic_istream[-3]] & 5) != 0) break;
        lVar11 = std::__cxx11::string::find((char)&local_580,0xd);
        if (lVar11 != -1) {
          std::__cxx11::string::substr((ulong)local_260,(ulong)&local_580);
          std::__cxx11::string::operator=((string *)&local_580,(string *)local_260);
          if ((cmQtAutoGen *)local_260._0_8_ != pcVar3) {
            operator_delete((void *)local_260._0_8_,(ulong)(local_250._M_allocated_capacity + 1));
          }
        }
        if (local_580._M_string_length != 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_540,&local_580);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_580._M_dataplus._M_p != &local_580.field_2) {
        operator_delete(local_580._M_dataplus._M_p,
                        (ulong)(local_580.field_2._M_allocated_capacity + 1));
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)local_490);
      std::ios_base::~ios_base(local_418);
      std::__cxx11::istringstream::istringstream
                ((istringstream *)local_490,(string *)&local_4f0,_S_in);
      local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
      local_5a0._M_string_length = 0;
      local_5a0.field_2._M_local_buf[0] = '\0';
      while( true ) {
        cVar8 = std::ios::widen((char)*(undefined8 *)(local_490._0_8_ + -0x18) +
                                (char)(istream *)local_490);
        piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                            ((istream *)local_490,(string *)&local_5a0,cVar8);
        uVar4 = *(uint *)(&piVar10->field_0x20 + (long)piVar10->_vptr_basic_istream[-3]);
        if ((uVar4 & 5) != 0) break;
        lVar11 = std::__cxx11::string::find((char)&local_5a0,0xd);
        if (lVar11 != -1) {
          std::__cxx11::string::substr((ulong)local_260,(ulong)&local_5a0);
          std::__cxx11::string::operator=((string *)&local_5a0,(string *)local_260);
          if ((cmQtAutoGen *)local_260._0_8_ != pcVar3) {
            operator_delete((void *)local_260._0_8_,(ulong)(local_250._M_allocated_capacity + 1));
          }
        }
        local_260._0_8_ = local_5a0._M_string_length;
        local_260._8_8_ = local_5a0._M_dataplus._M_p;
        __str._M_str = "RCC: Error in";
        __str._M_len = 0xd;
        iVar9 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_260,0,0xd,__str
                          );
        if (iVar9 == 0) {
          if ((RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
               ::searchString_abi_cxx11_ == '\0') &&
             (iVar9 = __cxa_guard_acquire(&RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
                                           ::searchString_abi_cxx11_), iVar9 != 0)) {
            RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
            ::searchString_abi_cxx11_ = &DAT_00b4a128;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)
                       &RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
                        ::searchString_abi_cxx11_,"Cannot find file \'","");
            __cxa_atexit(std::__cxx11::string::~string,
                         &RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
                          ::searchString_abi_cxx11_,&__dso_handle);
            __cxa_guard_release(&RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
                                 ::searchString_abi_cxx11_);
          }
          pcVar13 = DAT_00b4a120;
          lVar11 = std::__cxx11::string::find
                             ((char *)&local_5a0,
                              (ulong)RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
                                     ::searchString_abi_cxx11_,0);
          if (lVar11 == -1) {
            text_02._M_str = pcVar13;
            text_02._M_len = (size_t)local_5a0._M_dataplus._M_p;
            Quoted_abi_cxx11_(&local_510,(cmQtAutoGen *)local_5a0._M_string_length,text_02);
            local_260._0_8_ = (cmQtAutoGen *)0x1d;
            local_260._8_8_ = "rcc lists unparsable output:\n";
            local_250._M_allocated_capacity = 0;
            local_250._8_8_ = local_510._M_string_length;
            local_240 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_510._M_dataplus._M_p;
            local_580.field_2._M_allocated_capacity = (long)&local_580.field_2 + 8;
            local_580._M_dataplus._M_p = (pointer)0x0;
            local_580._M_string_length = 1;
            local_580.field_2._M_local_buf[8] = '\n';
            local_230 = (char *)0x1;
            local_220 = (char *)0x0;
            views_03._M_len = 3;
            views_03._M_array = (iterator)local_260;
            local_238 = &local_510;
            local_228 = (char *)local_580.field_2._M_allocated_capacity;
            cmCatViews((string *)local_538,views_03);
            std::__cxx11::string::operator=((string *)error,(string *)local_538);
            if ((pointer)local_538._0_8_ != (pointer)(local_538 + 0x10)) {
              operator_delete((void *)local_538._0_8_,(ulong)(local_538._16_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_510._M_dataplus._M_p != &local_510.field_2) {
              operator_delete(local_510._M_dataplus._M_p,
                              CONCAT71(local_510.field_2._M_allocated_capacity._1_7_,
                                       local_510.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
              operator_delete(local_5a0._M_dataplus._M_p,
                              CONCAT71(local_5a0.field_2._M_allocated_capacity._1_7_,
                                       local_5a0.field_2._M_local_buf[0]) + 1);
            }
            std::__cxx11::istringstream::~istringstream((istringstream *)local_490);
            std::ios_base::~ios_base(local_418);
            goto LAB_00603ce9;
          }
          std::__cxx11::string::substr((ulong)local_260,(ulong)&local_5a0);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    (local_540,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260)
          ;
          if ((cmQtAutoGen *)local_260._0_8_ != pcVar3) {
            operator_delete((void *)local_260._0_8_,(ulong)(local_250._M_allocated_capacity + 1));
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
        operator_delete(local_5a0._M_dataplus._M_p,
                        CONCAT71(local_5a0.field_2._M_allocated_capacity._1_7_,
                                 local_5a0.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)local_490);
      std::ios_base::~ios_base(local_418);
LAB_00603ce9:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
        operator_delete(local_4f0._M_dataplus._M_p,
                        CONCAT71(local_4f0.field_2._M_allocated_capacity._1_7_,
                                 local_4f0.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
        operator_delete(local_4d0._M_dataplus._M_p,
                        CONCAT71(local_4d0.field_2._M_allocated_capacity._1_7_,
                                 local_4d0.field_2._M_local_buf[0]) + 1);
      }
      if ((uVar4 & 5) != 0) goto LAB_00603d2c;
    }
    else {
      text_01._M_str = (char *)retVal_00;
      text_01._M_len = (size_t)(qrcFile->_M_dataplus)._M_p;
      Quoted_abi_cxx11_(&local_5a0,(cmQtAutoGen *)qrcFile->_M_string_length,text_01);
      local_490._0_8_ = (pointer)0x20;
      local_490._8_8_ = "The rcc list process failed for ";
      local_480._M_allocated_capacity = 0;
      local_480._8_8_ = local_5a0._M_string_length;
      local_470 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5a0._M_dataplus._M_p;
      local_458 = local_250._M_local_buf + 8;
      local_260._0_8_ = (cmQtAutoGen *)0x0;
      local_260._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x1;
      local_250._M_local_buf[8] = 10;
      local_460 = (char *)0x1;
      local_450 = (char *)0x0;
      views_02._M_len = 3;
      views_02._M_array = (iterator)local_490;
      local_468 = &local_5a0;
      local_250._M_allocated_capacity = (size_type)local_458;
      cmCatViews(&local_580,views_02);
      std::__cxx11::string::operator=((string *)error,(string *)&local_580);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_580._M_dataplus._M_p != &local_580.field_2) {
        operator_delete(local_580._M_dataplus._M_p,
                        (ulong)(local_580.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
        operator_delete(local_5a0._M_dataplus._M_p,
                        CONCAT71(local_5a0.field_2._M_allocated_capacity._1_7_,
                                 local_5a0.field_2._M_local_buf[0]) + 1);
      }
      if (local_4d0._M_string_length != 0) {
        local_260[0] = 10;
        cmStrCat<std::__cxx11::string&,char>((string *)local_490,&local_4d0,local_260);
        std::__cxx11::string::_M_append((char *)error,local_490._0_8_);
        if ((pointer)local_490._0_8_ != pcVar2) {
          operator_delete((void *)local_490._0_8_,local_480._M_allocated_capacity + 1);
        }
      }
      if (local_4f0._M_string_length != 0) {
        local_260[0] = 10;
        cmStrCat<std::__cxx11::string&,char>((string *)local_490,&local_4f0,local_260);
        std::__cxx11::string::_M_append((char *)error,local_490._0_8_);
        if ((pointer)local_490._0_8_ != pcVar2) {
          operator_delete((void *)local_490._0_8_,local_480._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
        operator_delete(local_4f0._M_dataplus._M_p,
                        CONCAT71(local_4f0.field_2._M_allocated_capacity._1_7_,
                                 local_4f0.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
        lVar11 = CONCAT71(local_4d0.field_2._M_allocated_capacity._1_7_,
                          local_4d0.field_2._M_local_buf[0]);
        _Var14._M_p = local_4d0._M_dataplus._M_p;
LAB_006034c6:
        operator_delete(_Var14._M_p,lVar11 + 1);
      }
    }
  }
  bVar7 = false;
LAB_00603d96:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
  }
  return bVar7;
}

Assistant:

bool cmQtAutoGen::RccLister::list(std::string const& qrcFile,
                                  std::vector<std::string>& files,
                                  std::string& error, bool verbose) const
{
  error.clear();

  if (!cmSystemTools::FileExists(qrcFile, true)) {
    error =
      cmStrCat("The resource file ", Quoted(qrcFile), " does not exist.");
    return false;
  }

  // Run rcc list command in the directory of the qrc file with the pathless
  // qrc file name argument.  This way rcc prints relative paths.
  // This avoids issues on Windows when the qrc file is in a path that
  // contains non-ASCII characters.
  std::string const fileDir = cmSystemTools::GetFilenamePath(qrcFile);

  if (!this->RccExcutable_.empty() &&
      cmSystemTools::FileExists(this->RccExcutable_, true) &&
      !this->ListOptions_.empty()) {

    bool result = false;
    int retVal = 0;
    std::string rccStdOut;
    std::string rccStdErr;
    {
      std::vector<std::string> cmd;
      cmd.emplace_back(this->RccExcutable_);
      cm::append(cmd, this->ListOptions_);
      cmd.emplace_back(cmSystemTools::GetFilenameName(qrcFile));

      // Log command
      if (verbose) {
        cmSystemTools::Stdout(
          cmStrCat("Running command:\n", QuotedCommand(cmd), '\n'));
      }

      result = cmSystemTools::RunSingleCommand(
        cmd, &rccStdOut, &rccStdErr, &retVal, fileDir.c_str(),
        cmSystemTools::OUTPUT_NONE, cmDuration::zero(), cmProcessOutput::Auto);
    }
    if (!result || retVal) {
      error =
        cmStrCat("The rcc list process failed for ", Quoted(qrcFile), '\n');
      if (!rccStdOut.empty()) {
        error += cmStrCat(rccStdOut, '\n');
      }
      if (!rccStdErr.empty()) {
        error += cmStrCat(rccStdErr, '\n');
      }
      return false;
    }
    if (!RccListParseOutput(rccStdOut, rccStdErr, files, error)) {
      return false;
    }
  } else {
    // We can't use rcc for the file listing.
    // Read the qrc file content into string and parse it.
    {
      std::string qrcContents;
      {
        cmsys::ifstream ifs(qrcFile.c_str());
        if (ifs) {
          std::ostringstream osst;
          osst << ifs.rdbuf();
          qrcContents = osst.str();
        } else {
          error = cmStrCat("The resource file ", Quoted(qrcFile),
                           " is not readable\n");
          return false;
        }
      }
      // Parse string content
      RccListParseContent(qrcContents, files);
    }
  }

  // Convert relative paths to absolute paths
  for (std::string& entry : files) {
    entry = cmSystemTools::CollapseFullPath(entry, fileDir);
  }
  return true;
}